

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_vhost_bind_wsi(lws_vhost *vh,lws *wsi)

{
  char *local_38;
  char *local_28;
  lws *wsi_local;
  lws_vhost *vh_local;
  
  if (wsi->vhost != vh) {
    wsi->vhost = vh;
    vh->count_bound_wsi = vh->count_bound_wsi + 1;
    if (wsi->role_ops == (lws_role_ops *)0x0) {
      local_28 = "none";
    }
    else {
      local_28 = wsi->role_ops->name;
    }
    if (wsi->protocol == (lws_protocols *)0x0) {
      local_38 = "none";
    }
    else {
      local_38 = wsi->protocol->name;
    }
    _lws_log(0x10,"%s: vh %s: wsi %s/%s, count_bound_wsi %d\n","lws_vhost_bind_wsi",vh->name,
             local_28,local_38,vh->count_bound_wsi);
    if (wsi->vhost->count_bound_wsi < 1) {
      __assert_fail("wsi->vhost->count_bound_wsi > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x3b,"void lws_vhost_bind_wsi(struct lws_vhost *, struct lws *)");
    }
  }
  return;
}

Assistant:

void
lws_vhost_bind_wsi(struct lws_vhost *vh, struct lws *wsi)
{
	if (wsi->vhost == vh)
		return;
	lws_context_lock(vh->context, __func__); /* ---------- context { */
	wsi->vhost = vh;
	vh->count_bound_wsi++;
	lws_context_unlock(vh->context); /* } context ---------- */
	lwsl_debug("%s: vh %s: wsi %s/%s, count_bound_wsi %d\n", __func__,
		   vh->name, wsi->role_ops ? wsi->role_ops->name : "none",
		   wsi->protocol ? wsi->protocol->name : "none",
		   vh->count_bound_wsi);
	assert(wsi->vhost->count_bound_wsi > 0);
}